

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O1

IWindowPtr __thiscall cursespp::LayoutBase::GetFocusableAt(LayoutBase *this,int index)

{
  long lVar1;
  _func_int **pp_Var2;
  int in_EDX;
  undefined4 in_register_00000034;
  long lVar3;
  IWindowPtr IVar4;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,index) + 0x1e0);
  IVar4.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (*(long *)(CONCAT44(in_register_00000034,index) + 0x1e8) - lVar1 >> 4);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)in_EDX <
      IVar4.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    lVar3 = (long)in_EDX * 0x10;
    (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable =
         *(_func_int ***)(lVar1 + lVar3);
    pp_Var2 = *(_func_int ***)(lVar1 + 8 + lVar3);
    (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable = pp_Var2;
    if (pp_Var2 != (_func_int **)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pp_Var2 + 1) = *(int *)(pp_Var2 + 1) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pp_Var2 + 1) = *(int *)(pp_Var2 + 1) + 1;
      }
    }
    IVar4.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (IWindowPtr)IVar4.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

IWindowPtr LayoutBase::GetFocusableAt(int index) {
    return this->focusable.at(index);
}